

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O0

void gen_trie(fb_output_t *out,trie_t *trie,int a,int b,int pos)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  bool local_5e;
  uint local_5c;
  int label;
  int has_descend;
  int prefix_guard;
  int has_prefix_key;
  int len;
  char *name;
  uint64_t mask;
  uint64_t tag;
  int local_28;
  int k;
  int x;
  int pos_local;
  int b_local;
  int a_local;
  trie_t *trie_local;
  fb_output_t *out_local;
  
  mask = 0;
  name = (char *)0x0;
  _has_prefix_key = "";
  prefix_guard = 0;
  local_5c = 0;
  k = pos;
  x = b;
  pos_local = a;
  _b_local = trie;
  trie_local = (trie_t *)out;
  iVar2 = get_dict_suffix_len(trie->dict + a,pos);
  if ((iVar2 == 0) &&
     ((x == pos_local ||
      ((x == pos_local + 1 && (iVar2 = get_dict_suffix_len(_b_local->dict + x,k), iVar2 == 0)))))) {
    gen_prefix_trie((fb_output_t *)trie_local,_b_local,pos_local,x,k,0);
  }
  else {
    local_28 = split_dict_left(_b_local->dict,pos_local,x,k);
    if (pos_local < local_28) {
      get_dict_tag(_b_local->dict + local_28,k,&mask,(uint64_t *)&name,(char **)&has_prefix_key,
                   &prefix_guard);
      println((fb_output_t *)trie_local,"if (w < 0x%lx) { /* branch \"%.*s\" */",mask,
              (ulong)(uint)prefix_guard,_has_prefix_key);
      *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + 1;
      gen_trie((fb_output_t *)trie_local,_b_local,pos_local,local_28 + -1,k);
      if (*(int *)&trie_local[5].dict == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x402,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
      }
      *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + -1;
      println((fb_output_t *)trie_local,"} else { /* branch \"%.*s\" */",(ulong)(uint)prefix_guard,
              _has_prefix_key);
      *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + 1;
      gen_trie((fb_output_t *)trie_local,_b_local,local_28,x,k);
      if (*(int *)&trie_local[5].dict == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x404,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
      }
      *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + -1;
      println((fb_output_t *)trie_local,"} /* branch \"%.*s\" */",(ulong)(uint)prefix_guard,
              _has_prefix_key);
    }
    else {
      local_28 = split_dict_right(_b_local->dict,pos_local,x,k);
      tag._4_4_ = split_dict_descend(_b_local->dict,pos_local,local_28 + -1,k);
      bVar1 = tag._4_4_ < local_28;
      if (bVar1) {
        bVar3 = false;
        if (pos_local < tag._4_4_) {
          iVar2 = get_dict_tag_len(_b_local->dict + (tag._4_4_ + -1),k);
          bVar3 = iVar2 == 8;
        }
        get_dict_tag(_b_local->dict + tag._4_4_,k,&mask,(uint64_t *)&name,(char **)&has_prefix_key,
                     &prefix_guard);
        println((fb_output_t *)trie_local,"if (w == 0x%lx) { /* descend \"%.*s\" */",mask,
                (ulong)(uint)prefix_guard,_has_prefix_key);
        *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + 1;
        if (bVar3) {
          println((fb_output_t *)trie_local,"/* descend prefix key \"%.*s\" */",
                  (ulong)(uint)prefix_guard,_has_prefix_key);
          (*_b_local->gen_match)
                    ((fb_output_t *)trie_local,_b_local->ct,_b_local->dict[tag._4_4_ + -1].data,
                     _b_local->dict[tag._4_4_ + -1].hint,8);
          println((fb_output_t *)trie_local,"/* descend suffix \"%.*s\" */",
                  (ulong)(uint)prefix_guard,_has_prefix_key);
        }
        println((fb_output_t *)trie_local,"buf += 8;");
        println((fb_output_t *)trie_local,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie((fb_output_t *)trie_local,_b_local,tag._4_4_,local_28 + -1,k + 8);
        if (bVar3) {
          if (*(int *)&trie_local[5].dict == 0) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x445,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
          }
          *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + -1;
          println((fb_output_t *)trie_local,"} /* desend suffix \"%.*s\" */",
                  (ulong)(uint)prefix_guard,_has_prefix_key);
          tag._4_4_ = tag._4_4_ + -1;
        }
        if (*(int *)&trie_local[5].dict == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x449,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
        }
        *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + -1;
        println((fb_output_t *)trie_local,"} else { /* descend \"%.*s\" */",
                (ulong)(uint)prefix_guard,_has_prefix_key);
        *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + 1;
      }
      local_5e = pos_local < tag._4_4_ && local_28 <= x;
      if (local_5e) {
        local_5c = _b_local->label + 1;
        _b_local->label = local_5c;
      }
      if (pos_local < tag._4_4_) {
        gen_prefix_trie((fb_output_t *)trie_local,_b_local,pos_local,tag._4_4_ + -1,k,local_5c);
      }
      if (local_5e) {
        println((fb_output_t *)trie_local,"goto endpfguard%d;",(ulong)local_5c);
        *(undefined4 *)&trie_local[5].gen_match = *(undefined4 *)&trie_local[5].dict;
        *(undefined4 *)&trie_local[5].dict = 0;
        println((fb_output_t *)trie_local,"pfguard%d:",(ulong)local_5c);
        *(undefined4 *)&trie_local[5].dict = *(undefined4 *)&trie_local[5].gen_match;
      }
      if (x < local_28) {
        if (tag._4_4_ <= pos_local) {
          (*_b_local->gen_unmatched)((fb_output_t *)trie_local);
        }
      }
      else {
        gen_trie((fb_output_t *)trie_local,_b_local,local_28,x,k);
      }
      if (local_5e) {
        *(undefined4 *)&trie_local[5].gen_match = *(undefined4 *)&trie_local[5].dict;
        *(undefined4 *)&trie_local[5].dict = 0;
        println((fb_output_t *)trie_local,"endpfguard%d:",(ulong)local_5c);
        *(undefined4 *)&trie_local[5].dict = *(undefined4 *)&trie_local[5].gen_match;
        println((fb_output_t *)trie_local,"(void)0;");
      }
      if (bVar1) {
        if (*(int *)&trie_local[5].dict == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x465,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
        }
        *(int *)&trie_local[5].dict = *(int *)&trie_local[5].dict + -1;
        println((fb_output_t *)trie_local,"} /* descend \"%.*s\" */",(ulong)(uint)prefix_guard,
                _has_prefix_key);
      }
    }
  }
  return;
}

Assistant:

static void gen_trie(fb_output_t *out, trie_t *trie, int a, int b, int pos)
{
    int x, k;
    uint64_t tag = 0, mask = 0;
    const char *name = "";
    int len = 0, has_prefix_key = 0, prefix_guard = 0, has_descend;
    int label = 0;

    /*
     * Process a trie at the level given by pos. A single level covers
     * one tag.
     *
     * A tag is a range of 8 characters [pos..pos+7] that is read as a
     * single big endian word and tested as against a ternary trie
     * generated in code. In generated code the tag is stored in "w".
     *
     * Normally trailing data in a tag is not a problem
     * because the difference between two keys happen in the middle and
     * trailing data is not valid key material. When the difference is
     * at the end, we get a lot of special cases to handle.
     *
     * Regardless, when we believe we have a match, a final check is
     * made to ensure that the next character after the match is not a
     * valid key character - for quoted keys a valid termiantot is a
     * quote, for unquoted keys it can be one of several characters -
     * therefore quoted keys are faster to parse, even if they consume
     * more space. The trie does not care about these details, the
     * gen_match function handles this transparently for different
     * symbol types.
     */


    /*
    * If we have one or two keys that terminate in this tag, there is no
    * need to do a branch test before matching exactly.
    *
    * We observe that `gen_prefix_trie` actually handles this
    * case well, even though it was not designed for it.
    */
    if ((get_dict_suffix_len(&trie->dict[a], pos) == 0) &&
        (b == a || (b == a + 1 && get_dict_suffix_len(&trie->dict[b], pos) == 0))) {
        gen_prefix_trie(out, trie, a, b, pos, 0);
        return;
    }

    /*
     * Due trie nature, we have a left, middle, and right range where
     * the middle range all compare the same at the current trie level
     * when masked against shortest (and first) key in middle range.
     */
    x = split_dict_left(trie->dict, a, b, pos);

    if (x > a) {
        /*
         * This is normal early branch with a key `a < x < b` such that
         * any shared prefix ranges do not span x.
         */
        get_dict_tag(&trie->dict[x], pos, &tag, &mask, &name, &len);
        println(out, "if (w < 0x%"PRIx64") { /* branch \"%.*s\" */", tag, len, name); indent();
        gen_trie(out, trie, a, x - 1, pos);
        unindent(); println(out, "} else { /* branch \"%.*s\" */", len, name); indent();
        gen_trie(out, trie, x, b, pos);
        unindent(); println(out, "} /* branch \"%.*s\" */", len, name);
        return;
    }
    x = split_dict_right(trie->dict, a, b, pos);

    /*
     * [a .. x-1] is a non-empty sequence of prefixes,
     * for example { a123, a1234, a12345 }.
     * The keys might not terminate in the current tag. To find those
     * that do, we will evaluate k such that:
     * [a .. k-1] are prefixes that terminate in the current tag if any
     * such exists.
     * [x..b] are keys that are prefixes up to at least pos + 7 but
     * do not terminate in the current tag.
     * [k..x-1] are prefixes that do not termiante in the current tag.
     * Note that they might not be prefixes when considering more than the
     * current tag.
     * The range [a .. x-1] can ge generated with `gen_prefix_trie`.
     *
     * We generally have the form
     *
     * [a..b] =
     * (a)<prefixes>, (k-1)<descend-prefix>, (k)<descend>, (x)<reminder>
     *
     * Where <prefixes> are keys that terminate at the current tag.
     * <descend> are keys that have the prefixes as prefix but do not
     * terminate at the current tag.
     * <descend-prerfix> is a single key that terminates exactly
     * where the tag ends. If there are no descend keys it is part of
     * prefixes, otherwise it is tested as a special case.
     * <reminder> are any keys larger than the prefixes.
     *
     * The reminder keys cannot be tested before we are sure that no
     * prefix is matching at least no prefixes that is not a
     * descend-prefix. This is because less than comparisons are
     * affected by trailing data within the tag caused by prefixes
     * terminating early. Trailing data is not a problem if two keys are
     * longer than the point where they differ even if they terminate
     * within the current tag.
     *
     * Thus, if we have non-empty <descend> and non-empty <reminder>,
     * the reminder must guard against any matches in prefix but not
     * against any matches in <descend>. If <descend> is empty and
     * <prefixes> == <descend-prefix> a guard is also not needed.
     */

    /* Find first prefix that does not terminate at the current level, or x if absent */
    k = split_dict_descend(trie->dict, a, x - 1, pos);
    has_descend = k < x;

    /* If we have a descend, process that in isolation. */
    if (has_descend) {
        has_prefix_key = k > a && get_dict_tag_len(&trie->dict[k - 1], pos) == 8;
        get_dict_tag(&trie->dict[k], pos, &tag, &mask, &name, &len);
        println(out, "if (w == 0x%"PRIx64") { /* descend \"%.*s\" */", tag, len, name); indent();
        if (has_prefix_key) {
            /* We have a key that terminates at the descend prefix. */
            println(out, "/* descend prefix key \"%.*s\" */", len, name);
            trie->gen_match(out, trie->ct, trie->dict[k - 1].data, trie->dict[k - 1].hint, 8);
            println(out, "/* descend suffix \"%.*s\" */", len, name);
        }
        println(out, "buf += 8;");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, trie, k, x - 1, pos + 8);
        if (has_prefix_key) {
            unindent(); println(out, "} /* desend suffix \"%.*s\" */", len, name);
            /* Here we move the <descend-prefix> key out of the <descend> range. */
            --k;
        }
        unindent(); println(out, "} else { /* descend \"%.*s\" */", len, name); indent();
    }
    prefix_guard = a < k && x <= b;
    if (prefix_guard) {
        label = ++trie->label;
    }
    if (a < k) {
        gen_prefix_trie(out, trie, a, k - 1, pos, label);
    }
    if (prefix_guard) {
        /* All prefixes tested, but none matched. */
        println(out, "goto endpfguard%d;", label);
        margin();
        println(out, "pfguard%d:", label);
        unmargin();
    }
    if (x <= b) {
        gen_trie(out, trie, x, b, pos);
    } else if (a >= k) {
        trie->gen_unmatched(out);
    }
    if (prefix_guard) {
        margin();
        println(out, "endpfguard%d:", label);
        unmargin();
        println(out, "(void)0;");
    }
    if (has_descend) {
        unindent(); println(out, "} /* descend \"%.*s\" */", len, name);
    }
}